

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

void __thiscall helics::BrokerBase::queueProcessingLoop(BrokerBase *this)

{
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this_00;
  ulong uVar1;
  size_type sVar2;
  string_view message;
  string_view message_00;
  undefined8 __p;
  bool bVar3;
  action_t aVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ActionMessage *command_00;
  ActionMessage *command_01;
  int iVar8;
  string_view name;
  string_view name_00;
  allocator<char> local_3ed;
  GlobalFederateId local_3ec;
  pointer local_3e8;
  LoopHandle contextLoop;
  shared_ptr<gmlc::networking::AsioContextManager> serv;
  type timerCallback;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> dumpMessages;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  anon_class_16_2_af978e1b logDump;
  anon_class_32_4_dda494f4 timerStop;
  optional<helics::ActionMessage> tcmd;
  string local_270;
  activeProtector active;
  steady_timer ticktimer;
  ActionMessage command;
  _Storage<helics::ActionMessage,_false> local_f0;
  
  if (((this->haltOperations)._M_base._M_i & 1U) == 0) {
    dumpMessages.super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dumpMessages.super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dumpMessages.super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
    super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
    super__Optional_payload_base<helics::ActionMessage>._M_payload._0_8_ =
         (long)&tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
                super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
                super__Optional_payload_base<helics::ActionMessage>._M_payload + 0x10;
    tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
    super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
    super__Optional_payload_base<helics::ActionMessage>._M_payload._8_8_ = 0;
    tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
    super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
    super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.dest_id.gid =
         (GlobalFederateId)
         ((uint)tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
                super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
                super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.dest_id.gid
         & 0xffffff00);
    gmlc::networking::AsioContextManager::getContextPointer
              ((AsioContextManager *)&serv,(string *)&tcmd);
    std::__cxx11::string::~string((string *)&tcmd);
    gmlc::networking::AsioContextManager::startContextLoop((AsioContextManager *)&contextLoop);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::basic_waitable_timer<asio::io_context>
              (&ticktimer,
               ((serv.
                 super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->ictx)._M_t.
               super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
               super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
               super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,0);
    timerStop.active = &active;
    active.m_obj.first = true;
    active.m_obj.second = false;
    active.m_mutex.super___mutex_base._M_mutex.__align = 0;
    active.m_mutex.super___mutex_base._M_mutex._8_8_ = 0;
    active.m_mutex.super___mutex_base._M_mutex._16_8_ = 0;
    active.m_mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0
    ;
    active.m_mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0
    ;
    uVar1 = (this->tickTimer).internalTimeCode;
    timerCallback.this = this;
    timerCallback.active = timerStop.active;
    if ((0 < (long)uVar1) && (this->disable_timer == false)) {
      if (uVar1 < 500000000) {
        (this->tickTimer).internalTimeCode = 500000000;
      }
      tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
      super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
      super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.messageAction._0_2_ =
           0x101;
      gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
                ((guarded<std::pair<bool,bool>,std::mutex> *)&active,(pair<bool,_bool> *)&tcmd);
      lVar5 = std::chrono::_V2::steady_clock::now();
      tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
      super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
      super__Optional_payload_base<helics::ActionMessage>._M_payload._0_8_ =
           lVar5 + (this->tickTimer).internalTimeCode;
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::expires_at(&ticktimer,(time_point *)&tcmd);
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::
      async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26)_&>
                (&ticktimer,&timerCallback);
    }
    timerStop.this = this;
    timerStop.ticktimer = &ticktimer;
    timerStop.contextLoop = &contextLoop;
    local_3e8 = (pointer)std::chrono::_V2::steady_clock::now();
    (this->global_broker_id_local).gid = (this->global_id)._M_i.gid;
    logDump.dumpMessages = &dumpMessages;
    logDump.this = this;
    if (((this->haltOperations)._M_base._M_i & 1U) == 0) {
      this_00 = &this->actionQueue;
      iVar8 = 0;
      while( true ) {
        gmlc::containers::
        BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::pop
                  (&command,this_00);
        LOCK();
        (this->messageCounter).super___atomic_base<unsigned_long>._M_i =
             (this->messageCounter).super___atomic_base<unsigned_long>._M_i + 1;
        UNLOCK();
        if (this->dumplog == true) {
          std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                    ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     &dumpMessages,&command);
        }
        if (command.messageAction != cmd_ignore) break;
LAB_0023efa1:
        ActionMessage::~ActionMessage(&command);
      }
      aVar4 = commandProcessor(this,&command);
      if (aVar4 == cmd_ignore) {
        iVar8 = iVar8 + 1;
        goto LAB_0023efa1;
      }
      if (aVar4 == cmd_tick) {
        if (((byte)command.flags & 0x10) != 0) {
          CLI::std::
          __uniq_ptr_impl<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
          ::reset((__uniq_ptr_impl<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                   *)&contextLoop,(pointer)0x0);
          gmlc::networking::AsioContextManager::startContextLoop((AsioContextManager *)&tcmd);
          __p = tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
                super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
                super__Optional_payload_base<helics::ActionMessage>._M_payload._0_8_;
          tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
          super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
          super__Optional_payload_base<helics::ActionMessage>._M_payload._0_8_ = 0;
          CLI::std::
          __uniq_ptr_impl<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
          ::reset((__uniq_ptr_impl<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                   *)&contextLoop,(pointer)__p);
          std::
          unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
          ::~unique_ptr((unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
                         *)&tcmd);
        }
        if ((this->brokerState)._M_i == CONNECTED_ERROR) {
          lVar6 = std::chrono::_V2::steady_clock::now();
          lVar5 = (this->errorDelay).internalTimeCode;
          lVar7 = (this->errorTimeStart).__d.__r;
          aVar4 = cmd_user_disconnect;
          if ((lVar6 - lVar7 < lVar5 - lVar5 % 1000000) &&
             (aVar4 = cmd_error_check, this->disable_timer == false)) {
            tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
            super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
            super__Optional_payload_base<helics::ActionMessage>._M_payload._0_8_ = lVar5 + lVar7;
            asio::
            basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
            ::expires_at(&ticktimer,(time_point *)&tcmd);
            tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
            super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
            super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.messageAction.
            _0_2_ = 0x101;
            gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
                      ((guarded<std::pair<bool,bool>,std::mutex> *)&active,(pair<bool,_bool> *)&tcmd
                      );
            asio::
            basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
            ::
            async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26)_&>
                      (&ticktimer,&timerCallback);
          }
          else {
            ActionMessage::setAction(&command,aVar4);
            addActionMessage(this,&command);
          }
        }
        else {
          if (iVar8 == 0) {
            command.messageID = this->forwardingReasons | 1;
            (*this->_vptr_BrokerBase[5])(this,&command);
          }
          else if (this->forwardTick == true) {
            command.messageID = this->forwardingReasons;
          }
          lVar5 = std::chrono::_V2::steady_clock::now();
          uVar1 = (this->maxCoSimDuration).internalTimeCode;
          if (((long)uVar1 < 1) || (lVar5 - (long)local_3e8 <= (long)(uVar1 - uVar1 % 1000000))) {
            lVar7 = (this->tickTimer).internalTimeCode;
            iVar8 = 0;
            if ((0 < lVar7) && (this->disable_timer == false)) {
              tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
              super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
              super__Optional_payload_base<helics::ActionMessage>._M_payload._0_8_ = lVar7 + lVar5;
              asio::
              basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
              ::expires_at(&ticktimer,(time_point *)&tcmd);
              tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
              super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
              super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.messageAction.
              _0_2_ = 0x101;
              gmlc::libguarded::guarded<std::pair<bool,bool>,std::mutex>::operator=
                        ((guarded<std::pair<bool,bool>,std::mutex> *)&active,
                         (pair<bool,_bool> *)&tcmd);
              asio::
              basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
              ::
              async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26)_&>
                        (&ticktimer,&timerCallback);
            }
          }
          else {
            ActionMessage::ActionMessage((ActionMessage *)&tcmd,cmd_timeout_disconnect);
            tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
            super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
            super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.dest_id.gid =
                 (GlobalFederateId)(this->global_broker_id_local).gid;
            tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
            super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
            super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.source_id.gid =
                 tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
                 super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
                 super__Optional_payload_base<helics::ActionMessage>._M_payload._M_value.dest_id.gid
            ;
            addActionMessage(this,(ActionMessage *)&tcmd);
            ActionMessage::~ActionMessage((ActionMessage *)&tcmd);
            iVar8 = 0;
          }
        }
        goto LAB_0023efa1;
      }
      if (aVar4 == cmd_base_configure) {
        baseConfigure(this,&command);
        goto LAB_0023efa1;
      }
      if (aVar4 == cmd_ping) {
        iVar8 = (iVar8 + 1) - (uint)(command.source_id.gid == 0);
        (*this->_vptr_BrokerBase[5])(this,&command);
        goto LAB_0023efa1;
      }
      if (aVar4 == cmd_error_check) {
        if ((this->brokerState)._M_i == CONNECTED_ERROR) {
          lVar7 = std::chrono::_V2::steady_clock::now();
          lVar7 = lVar7 - (this->errorTimeStart).__d.__r;
          lVar5 = (this->errorDelay).internalTimeCode;
          if (lVar5 - lVar5 % 1000000 < lVar7) {
            ActionMessage::setAction(&command,cmd_user_disconnect);
          }
          else {
            lVar5 = (this->tickTimer).internalTimeCode;
            if ((lVar5 == lVar7 * 2 || SBORROW8(lVar5,lVar7 * 2) != lVar5 + lVar7 * -2 < 0) &&
               (this->disable_timer != true)) goto LAB_0023efa1;
            tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
            super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
            super__Optional_payload_base<helics::ActionMessage>._M_payload._0_8_ = 200;
            std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                      ((duration<long,_std::ratio<1L,_1000L>_> *)&tcmd);
          }
          addActionMessage(this,&command);
        }
        goto LAB_0023efa1;
      }
      if (aVar4 == cmd_stop) {
        queueProcessingLoop::anon_class_32_4_dda494f4::operator()(&timerStop);
        if (((this->haltOperations)._M_base._M_i & 1U) == 0) {
          (*this->_vptr_BrokerBase[5])(this,&command);
          LOCK();
          (this->mainLoopIsRunning)._M_base._M_i = false;
          UNLOCK();
          queueProcessingLoop::anon_class_16_2_af978e1b::operator()(&logDump);
          (*this->_vptr_BrokerBase[3])(this,0);
        }
        gmlc::containers::
        BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::try_pop
                  (&tcmd,this_00);
        while (tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
               super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
               super__Optional_payload_base<helics::ActionMessage>._M_engaged == true) {
          bVar3 = isDisconnectCommand((ActionMessage *)&tcmd);
          if ((!bVar3) && (0x17 < (this->maxLogLevel).super___atomic_base<int>._M_i)) {
            local_3ec.gid = (this->global_broker_id_local).gid;
            local_3e8 = (this->identifier)._M_dataplus._M_p;
            sVar2 = (this->identifier)._M_string_length;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3a0,"STOPPED unprocessed command ",&local_3ed);
            prettyPrintString_abi_cxx11_(&local_270,(helics *)&tcmd,command_01);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_f0._M_value,&local_3a0,&local_270);
            message_00._M_str = (char *)local_f0._0_8_;
            message_00._M_len = local_f0._8_8_;
            name_00._M_str = local_3e8;
            name_00._M_len = sVar2;
            sendToLogger(this,local_3ec,0x18,name_00,message_00,false);
            std::__cxx11::string::~string((string *)&local_f0._M_value);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::~string((string *)&local_3a0);
          }
          gmlc::containers::
          BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::try_pop
                    ((optional<helics::ActionMessage> *)&local_f0._M_value,this_00);
          std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign
                    ((_Optional_payload_base<helics::ActionMessage> *)&tcmd,
                     (_Optional_payload_base<helics::ActionMessage> *)&local_f0._M_value);
          std::_Optional_payload_base<helics::ActionMessage>::_M_reset
                    ((_Optional_payload_base<helics::ActionMessage> *)&local_f0._M_value);
        }
      }
      else {
        if (aVar4 != cmd_terminate_immediately) goto LAB_0023efa1;
        queueProcessingLoop::anon_class_32_4_dda494f4::operator()(&timerStop);
        LOCK();
        (this->mainLoopIsRunning)._M_base._M_i = false;
        UNLOCK();
        queueProcessingLoop::anon_class_16_2_af978e1b::operator()(&logDump);
        gmlc::containers::
        BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::try_pop
                  (&tcmd,this_00);
        while (tcmd.super__Optional_base<helics::ActionMessage,_false,_false>._M_payload.
               super__Optional_payload<helics::ActionMessage,_true,_false,_false>.
               super__Optional_payload_base<helics::ActionMessage>._M_engaged == true) {
          bVar3 = isDisconnectCommand((ActionMessage *)&tcmd);
          if ((!bVar3) && (0x17 < (this->maxLogLevel).super___atomic_base<int>._M_i)) {
            local_3ec.gid = (this->global_broker_id_local).gid;
            local_3e8 = (this->identifier)._M_dataplus._M_p;
            sVar2 = (this->identifier)._M_string_length;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3a0,"TI unprocessed command ",&local_3ed);
            prettyPrintString_abi_cxx11_(&local_270,(helics *)&tcmd,command_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_f0._M_value,&local_3a0,&local_270);
            message._M_str = (char *)local_f0._0_8_;
            message._M_len = local_f0._8_8_;
            name._M_str = local_3e8;
            name._M_len = sVar2;
            sendToLogger(this,local_3ec,0x18,name,message,false);
            std::__cxx11::string::~string((string *)&local_f0._M_value);
            std::__cxx11::string::~string((string *)&local_270);
            std::__cxx11::string::~string((string *)&local_3a0);
          }
          gmlc::containers::
          BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::try_pop
                    ((optional<helics::ActionMessage> *)&local_f0._M_value,this_00);
          std::_Optional_payload_base<helics::ActionMessage>::_M_move_assign
                    ((_Optional_payload_base<helics::ActionMessage> *)&tcmd,
                     (_Optional_payload_base<helics::ActionMessage> *)&local_f0._M_value);
          std::_Optional_payload_base<helics::ActionMessage>::_M_reset
                    ((_Optional_payload_base<helics::ActionMessage> *)&local_f0._M_value);
        }
      }
      std::_Optional_payload_base<helics::ActionMessage>::_M_reset
                ((_Optional_payload_base<helics::ActionMessage> *)&tcmd);
      ActionMessage::~ActionMessage(&command);
    }
    else {
      queueProcessingLoop::anon_class_32_4_dda494f4::operator()(&timerStop);
      LOCK();
      (this->mainLoopIsRunning)._M_base._M_i = false;
      UNLOCK();
    }
    asio::detail::
    io_object_impl<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_asio::any_io_executor>
    ::~io_object_impl(&ticktimer.impl_);
    std::
    unique_ptr<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
    ::~unique_ptr(&contextLoop);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&serv.
                super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::~vector
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               &dumpMessages);
  }
  else {
    LOCK();
    (this->mainLoopIsRunning)._M_base._M_i = false;
    UNLOCK();
  }
  return;
}

Assistant:

void BrokerBase::queueProcessingLoop()
{
    if (haltOperations) {
        mainLoopIsRunning.store(false);
        return;
    }
    std::vector<ActionMessage> dumpMessages;
#ifndef HELICS_DISABLE_ASIO
    auto serv = gmlc::networking::AsioContextManager::getContextPointer();
    auto contextLoop = serv->startContextLoop();
    asio::steady_timer ticktimer(serv->getBaseContext());
    activeProtector active(true, false);

    auto timerCallback = [this, &active](const std::error_code& errorCode) {
        timerTickHandler(this, active, errorCode);
    };
    if (tickTimer > timeZero && !disable_timer) {
        if (tickTimer < Time(0.5)) {
            tickTimer = Time(0.5);
        }
        active = std::make_pair(true, true);
        ticktimer.expires_at(std::chrono::steady_clock::now() + tickTimer.to_ns());
        ticktimer.async_wait(timerCallback);
    }
    auto timerStop = [&, this]() {
        if (!haltTimer(active, ticktimer)) {
            sendToLogger(global_broker_id_local,
                         LogLevels::WARNING,
                         identifier,
                         "timer unable to cancel properly");
        }
        contextLoop = nullptr;
    };
    auto timeStart = std::chrono::steady_clock::now();
#else
    auto timerStop = []() {};
#endif

    global_broker_id_local = global_id.load();
    int messagesSinceLastTick = 0;
    auto logDump = [&, this]() {
        if (!dumpMessages.empty()) {
            for (auto& act : dumpMessages) {
                mLogManager->sendToLogger(HELICS_LOG_LEVEL_DUMPLOG,
                                          identifier,
                                          fmt::format("|| dl cmd:{} from {} to {}",
                                                      prettyPrintString(act),
                                                      act.source_id.baseValue(),
                                                      act.dest_id.baseValue()));
            }
        }
    };
    if (haltOperations) {
        timerStop();
        mainLoopIsRunning.store(false);
        return;
    }
    while (true) {
        auto command = actionQueue.pop();
        ++messageCounter;
        if (dumplog) {
            dumpMessages.push_back(command);
        }
        if (command.action() == CMD_IGNORE) {
            continue;
        }
        auto ret = commandProcessor(command);
        if (ret == CMD_IGNORE) {
            ++messagesSinceLastTick;
            continue;
        }
        switch (ret) {
            case CMD_TICK:
                if (checkActionFlag(command, error_flag)) {
#ifndef HELICS_DISABLE_ASIO
                    contextLoop = nullptr;
                    contextLoop = serv->startContextLoop();
#endif
                }
                // deal with error state timeout
                if (brokerState.load() == BrokerState::CONNECTED_ERROR) {
                    auto ctime = std::chrono::steady_clock::now();
                    auto timeDiff = ctime - errorTimeStart;
                    if (timeDiff >= errorDelay.to_ms()) {
                        command.setAction(CMD_USER_DISCONNECT);
                        addActionMessage(command);
                    } else {
#ifndef HELICS_DISABLE_ASIO
                        if (!disable_timer) {
                            ticktimer.expires_at(errorTimeStart + errorDelay.to_ns());
                            active = std::make_pair(true, true);
                            ticktimer.async_wait(timerCallback);
                        } else {
                            command.setAction(CMD_ERROR_CHECK);
                            addActionMessage(command);
                        }
#else
                        command.setAction(CMD_ERROR_CHECK);
                        addActionMessage(command);
#endif
                    }
                    break;
                }
#ifndef DISABLE_TICK
                if (messagesSinceLastTick == 0) {
                    command.messageID =
                        forwardingReasons | static_cast<uint32_t>(TickForwardingReasons::NO_COMMS);
                    processCommand(std::move(command));
                } else if (forwardTick) {
                    command.messageID = forwardingReasons;
                }
#endif
                messagesSinceLastTick = 0;
// reschedule the timer
#ifndef HELICS_DISABLE_ASIO
                {
                    auto currTime = std::chrono::steady_clock::now();
                    if (maxCoSimDuration > timeZero) {
                        if ((currTime - timeStart) > maxCoSimDuration.to_ms()) {
                            ActionMessage dDisable(CMD_TIMEOUT_DISCONNECT);
                            dDisable.source_id = global_broker_id_local;
                            dDisable.dest_id = global_broker_id_local;
                            addActionMessage(dDisable);
                            break;
                        }
                    }
                    if (tickTimer > timeZero && !disable_timer) {
                        ticktimer.expires_at(currTime + tickTimer.to_ns());
                        active = std::make_pair(true, true);
                        ticktimer.async_wait(timerCallback);
                    }
                }
#endif
                break;
            case CMD_ERROR_CHECK:
                if (brokerState.load() == BrokerState::CONNECTED_ERROR) {
                    auto ctime = std::chrono::steady_clock::now();
                    auto timeDiff = ctime - errorTimeStart;
                    if (timeDiff > errorDelay.to_ms()) {
                        command.setAction(CMD_USER_DISCONNECT);
                        addActionMessage(command);
                    } else {
#ifndef HELICS_DISABLE_ASIO
                        if (tickTimer > timeDiff * 2 || disable_timer) {
                            std::this_thread::sleep_for(std::chrono::milliseconds(200));
                            addActionMessage(command);
                        }
#else
                        std::this_thread::sleep_for(std::chrono::milliseconds(200));
                        addActionMessage(command);
#endif
                    }
                }
                break;
            case CMD_PING:
                // ping is processed normally but doesn't count as an actual message for timeout
                // purposes unless it comes from the parent
                if (command.source_id != parent_broker_id) {
                    ++messagesSinceLastTick;
                }
                processCommand(std::move(command));
                break;
            case CMD_BASE_CONFIGURE:
                baseConfigure(command);
                break;
            case CMD_IGNORE:
            default:
                break;
            case CMD_TERMINATE_IMMEDIATELY:
                timerStop();
                mainLoopIsRunning.store(false);
                logDump();
                {
                    auto tcmd = actionQueue.try_pop();
                    while (tcmd) {
                        if (!isDisconnectCommand(*tcmd)) {
                            LOG_TRACE(global_broker_id_local,
                                      identifier,
                                      std::string("TI unprocessed command ") +
                                          prettyPrintString(*tcmd));
                        }
                        tcmd = actionQueue.try_pop();
                    }
                }
                return;  // immediate return
            case CMD_STOP:
                timerStop();
                if (!haltOperations) {
                    processCommand(std::move(command));
                    mainLoopIsRunning.store(false);
                    logDump();
                    processDisconnect();
                }
                auto tcmd = actionQueue.try_pop();
                while (tcmd) {
                    if (!isDisconnectCommand(*tcmd)) {
                        LOG_TRACE(global_broker_id_local,
                                  identifier,
                                  std::string("STOPPED unprocessed command ") +
                                      prettyPrintString(*tcmd));
                    }
                    tcmd = actionQueue.try_pop();
                }
                return;
        }
    }
}